

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O3

SUNErrCode SUNLinSolSetScalingVectors(SUNLinearSolver S,N_Vector s1,N_Vector s2)

{
  _func_SUNErrCode_SUNLinearSolver_N_Vector_N_Vector *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  UNRECOVERED_JUMPTABLE = S->ops->setscalingvectors;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_SUNLinearSolver_N_Vector_N_Vector *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(S,s1,s2);
    return SVar1;
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSetScalingVectors(SUNLinearSolver S, N_Vector s1, N_Vector s2)
{
  SUNErrCode ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->setscalingvectors) { ier = S->ops->setscalingvectors(S, s1, s2); }
  else { ier = SUN_SUCCESS; }
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return (ier);
}